

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPVariantClause::generateDOT
          (OpenMPVariantClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  pointer pcVar1;
  OpenMPDirective *pOVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  pointer ppVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  size_type *psVar14;
  ulong *puVar15;
  long *plVar16;
  undefined4 in_register_00000014;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  OpenMPClauseKind OVar20;
  uint uVar21;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string node_id;
  string current_line;
  string indent;
  string clause_string;
  string clause_type;
  string parameter_string;
  string __str_2;
  string __str_1;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ofstream *local_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  OpenMPVariantClause *local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  char local_198;
  undefined7 uStack_197;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  OpenMPClauseKind local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined8 local_140;
  undefined1 *local_138;
  char *local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  int local_114;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  undefined1 local_50 [32];
  
  local_140 = CONCAT44(in_register_00000014,depth);
  local_110 = &local_100;
  local_108 = 0;
  local_100 = 0;
  local_1a8 = &local_198;
  local_1a0 = 0;
  local_198 = '\0';
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_238 = dot_file;
  local_1b0 = this;
  std::__cxx11::string::_M_construct((ulong)&local_188,(char)depth);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_138 = &local_128;
  local_130 = (char *)0x0;
  local_128 = 0;
  std::__cxx11::string::substr((ulong)&local_1d0,(ulong)parent_node);
  std::__cxx11::string::operator=((string *)parent_node,(string *)&local_1d0);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  OVar20 = (local_1b0->super_OpenMPClause).kind;
  if (OVar20 == OMPC_when) {
    pcVar13 = "when";
LAB_00160a0d:
    std::__cxx11::string::_M_replace((ulong)&local_138,0,local_130,(ulong)pcVar13);
  }
  else {
    if (OVar20 == OMPC_match) {
      pcVar13 = "match";
      goto LAB_00160a0d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The variant clause is not supported.\n",0x25);
  }
  local_1f0[0] = local_1e0;
  pcVar1 = (parent_node->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f0,pcVar1,pcVar1 + parent_node->_M_string_length);
  std::__cxx11::string::append((char *)local_1f0);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_138);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar14 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_210.field_2._M_allocated_capacity = *psVar14;
    local_210.field_2._8_8_ = plVar6[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar14;
    local_210._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_210._M_string_length = plVar6[1];
  *plVar6 = (long)psVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  puVar15 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_258.field_2._M_allocated_capacity = *puVar15;
    local_258.field_2._8_8_ = plVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar15;
    local_258._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_258._M_string_length = plVar6[1];
  *plVar6 = (long)puVar15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar22 = (uint)local_140;
  uVar19 = -uVar22;
  if (0 < (int)uVar22) {
    uVar19 = uVar22;
  }
  uVar21 = 1;
  if (9 < uVar19) {
    uVar17 = (ulong)uVar19;
    uVar12 = 4;
    do {
      uVar21 = uVar12;
      uVar11 = (uint)uVar17;
      if (uVar11 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00160b8e;
      }
      if (uVar11 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00160b8e;
      }
      if (uVar11 < 10000) goto LAB_00160b8e;
      uVar17 = uVar17 / 10000;
      uVar12 = uVar21 + 4;
    } while (99999 < uVar11);
    uVar21 = uVar21 + 1;
  }
LAB_00160b8e:
  local_164 = OVar20;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)-((int)uVar22 >> 0x1f) + (char)uVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uint)-((int)uVar22 >> 0x1f) + (long)local_d0),uVar21,uVar19);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    uVar10 = local_258.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_c8 + local_258._M_string_length) {
    uVar17 = 0xf;
    if (local_d0 != local_c0) {
      uVar17 = local_c0[0];
    }
    if (uVar17 < local_c8 + local_258._M_string_length) goto LAB_00160c1e;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
  }
  else {
LAB_00160c1e:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_d0);
  }
  local_278 = &local_268;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_268 = *plVar6;
    lStack_260 = puVar7[3];
  }
  else {
    local_268 = *plVar6;
    local_278 = (long *)*puVar7;
  }
  local_270 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_230 = &local_220;
  puVar15 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar15) {
    local_220 = *puVar15;
    lStack_218 = plVar6[3];
  }
  else {
    local_220 = *puVar15;
    local_230 = (ulong *)*plVar6;
  }
  local_228 = plVar6[1];
  *plVar6 = (long)puVar15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar19 = -index;
  if (0 < index) {
    uVar19 = index;
  }
  uVar22 = 1;
  if (9 < uVar19) {
    uVar17 = (ulong)uVar19;
    uVar21 = 4;
    do {
      uVar22 = uVar21;
      uVar12 = (uint)uVar17;
      if (uVar12 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_00160d2c;
      }
      if (uVar12 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_00160d2c;
      }
      if (uVar12 < 10000) goto LAB_00160d2c;
      uVar17 = uVar17 / 10000;
      uVar21 = uVar22 + 4;
    } while (99999 < uVar12);
    uVar22 = uVar22 + 1;
  }
LAB_00160d2c:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar22 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)index >> 0x1f) + (long)local_f0),uVar22,uVar19);
  uVar17 = 0xf;
  if (local_230 != &local_220) {
    uVar17 = local_220;
  }
  if (uVar17 < (ulong)(local_e8 + local_228)) {
    uVar17 = 0xf;
    if (local_f0 != local_e0) {
      uVar17 = local_e0[0];
    }
    if (uVar17 < (ulong)(local_e8 + local_228)) goto LAB_00160dbd;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_00160dbd:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_f0);
  }
  local_1d0 = &local_1c0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_1c0 = *plVar6;
    lStack_1b8 = puVar7[3];
  }
  else {
    local_1c0 = *plVar6;
    local_1d0 = (long *)*puVar7;
  }
  local_1c8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1d0);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  std::operator+(&local_258,&local_188,parent_node);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278 = &local_268;
  plVar16 = plVar6 + 2;
  if ((long *)*plVar6 == plVar16) {
    local_268 = *plVar16;
    lStack_260 = plVar6[3];
  }
  else {
    local_268 = *plVar16;
    local_278 = (long *)*plVar6;
  }
  local_270 = plVar6[1];
  *plVar6 = (long)plVar16;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_278,(ulong)local_160._M_dataplus._M_p);
  local_230 = &local_220;
  puVar15 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar15) {
    local_220 = *puVar15;
    lStack_218 = plVar6[3];
  }
  else {
    local_220 = *puVar15;
    local_230 = (ulong *)*plVar6;
  }
  local_228 = plVar6[1];
  *plVar6 = (long)puVar15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
  plVar16 = plVar6 + 2;
  if ((long *)*plVar6 == plVar16) {
    local_1c0 = *plVar16;
    lStack_1b8 = plVar6[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar16;
    local_1d0 = (long *)*plVar6;
  }
  local_1c8 = plVar6[1];
  *plVar6 = (long)plVar16;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1d0);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  pcVar13 = local_1a8;
  if (local_1a8 == (char *)0x0) {
    std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
  }
  else {
    sVar8 = strlen(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
  }
  std::__cxx11::string::append((char *)&local_188);
  std::operator+(&local_258,&local_188,&local_160);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278 = &local_268;
  plVar16 = plVar6 + 2;
  if ((long *)*plVar6 == plVar16) {
    local_268 = *plVar16;
    lStack_260 = plVar6[3];
  }
  else {
    local_268 = *plVar16;
    local_278 = (long *)*plVar6;
  }
  local_270 = plVar6[1];
  *plVar6 = (long)plVar16;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_138);
  local_230 = &local_220;
  puVar15 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar15) {
    local_220 = *puVar15;
    lStack_218 = plVar6[3];
  }
  else {
    local_220 = *puVar15;
    local_230 = (ulong *)*plVar6;
  }
  local_228 = plVar6[1];
  *plVar6 = (long)puVar15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
  plVar16 = plVar6 + 2;
  if ((long *)*plVar6 == plVar16) {
    local_1c0 = *plVar16;
    lStack_1b8 = plVar6[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar16;
    local_1d0 = (long *)*plVar6;
  }
  local_1c8 = plVar6[1];
  *plVar6 = (long)plVar16;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1d0);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  pcVar13 = local_1a8;
  if (local_1a8 == (char *)0x0) {
    std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
  }
  else {
    sVar8 = strlen(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
  }
  local_1d0 = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  if ((local_1b0->user_condition_expression).second._M_string_length != 0) {
    local_230 = &local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    std::operator+(&local_210,&local_188,&local_160);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    if ((local_1b0->user_condition_expression).first._M_string_length != 0) {
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_258,
                                  (ulong)(local_1b0->user_condition_expression).first._M_dataplus.
                                         _M_p);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    puVar15 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258.field_2._8_8_ = plVar6[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_258,
                                (ulong)(local_1b0->user_condition_expression).second._M_dataplus.
                                       _M_p);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
  }
  if ((local_1b0->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_1b0->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_230 = &local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    std::operator+(&local_210,&local_188,&local_160);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    ppVar9 = (local_1b0->construct_directives).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((local_1b0->construct_directives).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
      local_114 = (int)local_140 + 2;
      uVar17 = 0;
      do {
        pOVar2 = ppVar9[uVar17].second;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_1d0,local_1c8 + (long)local_1d0);
        ppVar9 = (local_1b0->construct_directives).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = ((long)(local_1b0->construct_directives).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3) *
                 -0x3333333333333333;
        if (uVar18 < uVar17 || uVar18 - uVar17 == 0) {
          uVar10 = std::__throw_out_of_range_fmt
                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              ,uVar17);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xcccccccccccccccd) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((OpenMPDirective *)local_50._0_8_ != pOVar2) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
          }
          _Unwind_Resume(uVar10);
        }
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        _Var3._M_p = ppVar9[uVar17].first._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,_Var3._M_p,_Var3._M_p + ppVar9[uVar17].first._M_string_length
                  );
        OpenMPDirective::generateDOT(pOVar2,local_238,local_114,(int)uVar17,&local_90,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        ppVar9 = (local_1b0->construct_directives).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = ((long)(local_1b0->construct_directives).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3) *
                 -0x3333333333333333;
      } while (uVar17 <= uVar18 && uVar18 - uVar17 != 0);
    }
  }
  if ((local_1b0->arch_expression).second._M_string_length == 0) {
    bVar4 = false;
  }
  else {
    local_230 = &local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    paVar23 = &local_210.field_2;
    paVar24 = &local_258.field_2;
    std::__cxx11::string::append((char *)&local_230);
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    std::operator+(&local_210,&local_188,&local_160);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_258._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_258._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    if ((local_1b0->arch_expression).first._M_string_length != 0) {
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_258,
                                  (ulong)(local_1b0->arch_expression).first._M_dataplus._M_p);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_258,
                                (ulong)(local_1b0->arch_expression).second._M_dataplus._M_p);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      bVar4 = true;
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      bVar4 = true;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
  }
  OVar20 = local_164;
  paVar24 = &local_258.field_2;
  paVar23 = &local_210.field_2;
  iVar5 = std::__cxx11::string::compare((char *)&(local_1b0->isa_expression).second);
  if (iVar5 != 0) {
    if (!bVar4) {
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_160._M_dataplus._M_p,
                 local_160._M_dataplus._M_p + local_160._M_string_length);
      std::__cxx11::string::append((char *)&local_230);
      std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      std::operator+(&local_210,&local_188,&local_160);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_258.field_2._M_allocated_capacity = *puVar15;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar15;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
      local_258._M_dataplus._M_p = (pointer)paVar24;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)&local_258);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        bVar4 = true;
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        bVar4 = true;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_258._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    if ((local_1b0->isa_expression).first._M_string_length != 0) {
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_258,
                                  (ulong)(local_1b0->isa_expression).first._M_dataplus._M_p);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_258,
                                (ulong)(local_1b0->isa_expression).second._M_dataplus._M_p);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      OVar20 = local_164;
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      OVar20 = local_164;
    }
  }
  local_108 = 0;
  *local_110 = 0;
  switch((local_1b0->context_kind_name).second) {
  case OMPC_CONTEXT_KIND_host:
    pcVar13 = "host";
    break;
  case OMPC_CONTEXT_KIND_nohost:
    pcVar13 = "nohost";
    break;
  case OMPC_CONTEXT_KIND_any:
    pcVar13 = "any";
    break;
  case OMPC_CONTEXT_KIND_cpu:
    pcVar13 = "cpu";
    break;
  case OMPC_CONTEXT_KIND_gpu:
    pcVar13 = "gpu";
    break;
  case OMPC_CONTEXT_KIND_fpga:
    pcVar13 = "fpga";
    break;
  case OMPC_CONTEXT_KIND_unknown:
    goto switchD_00164a82_caseD_6;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The context kind is not supported.\n",0x23);
    goto switchD_00164a82_caseD_6;
  }
  std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)0x0,(ulong)pcVar13);
switchD_00164a82_caseD_6:
  if (local_108 != 0) {
    if (!bVar4) {
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_160._M_dataplus._M_p,
                 local_160._M_dataplus._M_p + local_160._M_string_length);
      std::__cxx11::string::append((char *)&local_230);
      std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      std::operator+(&local_210,&local_188,&local_160);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_258.field_2._M_allocated_capacity = *puVar15;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar15;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
      local_258._M_dataplus._M_p = (pointer)paVar24;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)&local_258);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_258._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    if ((local_1b0->context_kind_name).first._M_string_length != 0) {
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar6[3];
        local_210._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_210._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar14;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_258,
                                  (ulong)(local_1b0->context_kind_name).first._M_dataplus._M_p);
      local_278 = &local_268;
      plVar16 = plVar6 + 2;
      if ((long *)*plVar6 == plVar16) {
        local_268 = *plVar16;
        lStack_260 = plVar6[3];
      }
      else {
        local_268 = *plVar16;
        local_278 = (long *)*plVar6;
      }
      local_270 = plVar6[1];
      *plVar6 = (long)plVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar15 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar15) {
        local_220 = *puVar15;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar15;
        local_230 = (ulong *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)puVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar24) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar23) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      pcVar13 = local_1a8;
      if (local_1a8 == (char *)0x0) {
        std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      }
      else {
        sVar8 = strlen(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      }
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar14;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1d0);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
    }
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d0);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar15;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_110);
    local_278 = &local_268;
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_268 = *plVar16;
      lStack_260 = plVar6[3];
    }
    else {
      local_268 = *plVar16;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    puVar15 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar15) {
      local_220 = *puVar15;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar15;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar15;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar24) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar23) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    pcVar13 = local_1a8;
    if (local_1a8 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(*(long *)local_238 + -0x18));
      OVar20 = local_164;
    }
    else {
      sVar8 = strlen(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar13,sVar8);
      OVar20 = local_164;
    }
  }
  if ((OVar20 == OMPC_when) &&
     (pOVar2 = (OpenMPDirective *)local_1b0[1].super_OpenMPClause._vptr_OpenMPClause,
     pOVar2 != (OpenMPDirective *)0x0)) {
    local_50._0_8_ = (OpenMPDirective *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    OpenMPDirective::generateDOT(pOVar2,local_238,(int)local_140 + 1,0,(string *)local_50,&local_70)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((OpenMPDirective *)local_50._0_8_ != (OpenMPDirective *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,
                    CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                             local_160.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  return;
}

Assistant:

void OpenMPVariantClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string parameter_string;
    std::pair<std::string, std::string>* parameter_pair_string;
    std::vector<std::pair<std::string, OpenMPDirective*> >* parameter_pair_directives;
    OpenMPDirective* variant_directive = NULL;

/*

    // check implementation
    clause_string.clear();
    parameter_string.clear();
    // check implementation vendor
    OpenMPClauseContextVendor context_vendor = this->getImplementationKind();
    switch (context_vendor) {
        case OMPC_CONTEXT_VENDOR_amd:
            parameter_string = "amd";
            break;
        case OMPC_CONTEXT_VENDOR_arm:
            parameter_string = "arm";
            break;
        case OMPC_CONTEXT_VENDOR_bsc:
            parameter_string = "bsc";
            break;
        case OMPC_CONTEXT_VENDOR_cray:
            parameter_string = "cray";
            break;
        case OMPC_CONTEXT_VENDOR_fujitsu:
            parameter_string = "fujitsu";
            break;
        case OMPC_CONTEXT_VENDOR_gnu:
            parameter_string = "gnu";
            break;
        case OMPC_CONTEXT_VENDOR_ibm:
            parameter_string = "ibm";
            break;
        case OMPC_CONTEXT_VENDOR_intel:
            parameter_string = "intel";
            break;
        case OMPC_CONTEXT_VENDOR_llvm:
            parameter_string = "llvm";
            break;
        case OMPC_CONTEXT_VENDOR_pgi:
            parameter_string = "pgi";
            break;
        case OMPC_CONTEXT_VENDOR_ti:
            parameter_string = "ti";
            break;
        case OMPC_CONTEXT_VENDOR_unknown:
            parameter_string = "unknown";
            break;
        case OMPC_CONTEXT_VENDOR_unspecified:
            break;
        default:
            std::cout << "The context vendor is not supported.\n";
    };
    if (parameter_string.size() > 0) {
        clause_string += "vendor(" + parameter_string + "), ";
    };

    // check implementation extension
    parameter_string = this->getExtensionExpression();
    if (parameter_string.size() > 0) {
        clause_string += "extension(" + parameter_string + "), ";
    };

    if (clause_string.size() > 0) {
        result += "implementation = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    clause_string.clear();
    result = result.substr(0, result.size()-2);



    result += clause_string + ") ";

    //return result;*/
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string clause_string;
    std::string clause_type;
    //std::vector<OpenMPDirective*>* parameter_directives;
    parent_node = parent_node.substr(0, parent_node.size()-1);
    OpenMPClauseKind clause_kind = this->getKind();
    switch (clause_kind) {
        case OMPC_when:
            clause_type = "when";
            break;
        case OMPC_match:
            clause_type = "match";
            break;
        default:
            std::cout << "The variant clause is not supported.\n";
    };
    clause_string = parent_node + "_" + clause_type + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_string + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_string + " [label = \"" + clause_type + "\"]\n";
    dot_file << current_line.c_str();

    std::string node_id = "";
    // check user
    parameter_pair_string = this->getUserCondition();
    if (parameter_pair_string->second.size() > 0) {
        node_id = clause_string + "_user_condition";
        current_line = indent + clause_string + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"user_condition\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0) {
            current_line = indent + "\t" + node_id + " -- " + node_id + "_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t" + node_id + "_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output condition expression
        current_line = indent + "\t" + node_id + " -- " + node_id + "_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check construct
    parameter_pair_directives = this->getConstructDirective();
    if (parameter_pair_directives->size() != 0) {
        node_id = clause_string + "_construct";
        current_line = indent + clause_string + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"construct\"]\n";
        dot_file << current_line.c_str();
        for (unsigned int i = 0; i < parameter_pair_directives->size(); i++) {
            parameter_pair_directives->at(i).second->generateDOT(dot_file, depth+2, i, node_id, parameter_pair_directives->at(i).first);
        };
    };

    // check device_arch
    bool has_device = false;
    parameter_pair_string = this->getArchExpression();
    if (parameter_pair_string->second.size() > 0) {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_arch\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_arch [label = \"arch\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0 ) {
            current_line = indent + "\t\t" + node_id + "_arch -- " + node_id + "_arch_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_arch_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output arch expression
        current_line = indent + "\t\t" + node_id + "_arch -- " + node_id + "_arch_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_arch_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check device_isa
    parameter_pair_string = this->getIsaExpression();
    if (parameter_pair_string->second != "") {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_isa\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_isa [label = \"isa\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0) {
            current_line = indent + "\t\t" + node_id + "_isa -- " + node_id + "_isa_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_isa_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output isa expression
        current_line = indent + "\t\t" + node_id + "_isa -- " + node_id + "_isa_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_isa_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check device_kind
    parameter_string.clear();
    std::pair<std::string, OpenMPClauseContextKind>* context_kind = this->getContextKind();
    switch (context_kind->second) {
        case OMPC_CONTEXT_KIND_host:
            parameter_string = "host";
            break;
        case OMPC_CONTEXT_KIND_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_CONTEXT_KIND_any:
            parameter_string = "any";
            break;
        case OMPC_CONTEXT_KIND_cpu:
            parameter_string = "cpu";
            break;
        case OMPC_CONTEXT_KIND_gpu:
            parameter_string = "gpu";
            break;
        case OMPC_CONTEXT_KIND_fpga:
            parameter_string = "fpga";
            break;
        case OMPC_CONTEXT_KIND_unknown:
            break;
        default:
            std::cout << "The context kind is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_kind\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_kind [label = \"kind\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (context_kind->first.size() > 0) {
            current_line = indent + "\t\t" + node_id + "_kind -- " + node_id + "_kind_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_kind_score [label = \"score\\n " + context_kind->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output kind value
        current_line = indent + "\t\t" + node_id + "_kind -- " + node_id + "_kind_value\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_kind_value [label = \"" + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    if (clause_kind == OMPC_when) {
        variant_directive = ((OpenMPWhenClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_string, "");
        };
    };
}